

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithmFORTRAN_wrap.cxx
# Opt level: O0

int find_sorted<int>(int *DATA,size_t SIZE,int value)

{
  int *piVar1;
  size_t sVar2;
  size_t result;
  size_t sStack_20;
  int value_local;
  size_t SIZE_local;
  int *DATA_local;
  
  result._4_4_ = value;
  sStack_20 = SIZE;
  SIZE_local = (size_t)DATA;
  piVar1 = std::lower_bound<int_const*,int>(DATA,DATA + SIZE,(int *)((long)&result + 4));
  sVar2 = (long)((long)piVar1 - SIZE_local) >> 2;
  if ((sVar2 == sStack_20) || (*(int *)(SIZE_local + sVar2 * 4) != result._4_4_)) {
    DATA_local._4_4_ = 0;
  }
  else {
    DATA_local._4_4_ = (int)sVar2 + 1;
  }
  return DATA_local._4_4_;
}

Assistant:

int find_sorted(const T *DATA, size_t SIZE, T value) {
  size_t result = std::lower_bound(DATA, DATA + SIZE, value) - DATA;
  if (result == SIZE || DATA[result] != value) return 0;
  return result + 1;
}